

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageFilledEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int local_68;
  int local_64;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  
  local_64 = w >> 1;
  lVar2 = (long)local_64;
  local_68 = mx - local_64;
  local_60 = mx + lVar2;
  if ((long)local_68 <= (long)local_60) {
    lVar3 = (long)local_68 + -1;
    iVar5 = local_68;
    do {
      gdImageSetPixel(im,iVar5,my,c);
      lVar3 = lVar3 + 1;
      iVar5 = iVar5 + 1;
    } while (lVar3 < (long)local_60);
  }
  if (0 < local_64) {
    lVar3 = (long)(h >> 1) * (long)(h >> 1);
    local_50 = lVar3 * lVar2;
    local_48 = local_50 * 2;
    local_58 = 0;
    iVar5 = my;
    iVar6 = -2;
    do {
      if (local_50 < 1) {
LAB_0010f4b6:
        local_64 = local_64 + -1;
        local_68 = local_68 + 1;
        local_60 = (ulong)((int)local_60 - 1);
        local_48 = local_48 + lVar3 * -2;
        local_50 = local_50 + local_48;
      }
      else {
        my = my + 1;
        iVar5 = iVar5 + -1;
        local_58 = local_58 + lVar2 * lVar2 * 2;
        lVar4 = local_50 - local_58;
        bVar1 = local_50 < local_58;
        local_50 = lVar4;
        if (lVar4 == 0 || bVar1) goto LAB_0010f4b6;
      }
      if ((iVar6 != iVar5) && (local_68 <= (int)local_60)) {
        iVar6 = local_68;
        do {
          gdImageSetPixel(im,iVar6,my,c);
          iVar6 = iVar6 + 1;
        } while ((int)local_60 + 1 != iVar6);
        iVar6 = local_68;
        if (local_68 <= (int)local_60) {
          do {
            gdImageSetPixel(im,iVar6,iVar5,c);
            iVar6 = iVar6 + 1;
          } while ((int)local_60 + 1 != iVar6);
        }
      }
      iVar6 = iVar5;
    } while (0 < local_64);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledEllipse (gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;
	int i;
	int old_y2;

	a=w>>1;
	b=h>>1;

	for (x = mx-a; x <= mx+a; x++) {
		gdImageSetPixel(im, x, my, c);
	}

	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	old_y2=-2;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my1,c);
			}
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my2,c);
			}
		}
		old_y2 = my2;
	}
}